

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O0

void __thiscall
ParamListStandard::getRangeList(ParamListStandard *this,AddrSpace *spc,RangeList *res)

{
  bool bVar1;
  int4 iVar2;
  reference pPVar3;
  AddrSpace *pAVar4;
  uintb first;
  uintb endoff;
  uintb baseoff;
  _List_node_base *local_30;
  _List_const_iterator<ParamEntry> local_28;
  const_iterator iter;
  RangeList *res_local;
  AddrSpace *spc_local;
  ParamListStandard *this_local;
  
  iter._M_node = (_List_node_base *)res;
  std::_List_const_iterator<ParamEntry>::_List_const_iterator(&local_28);
  local_30 = (_List_node_base *)
             std::__cxx11::list<ParamEntry,_std::allocator<ParamEntry>_>::begin(&this->entry);
  local_28._M_node = local_30;
  while( true ) {
    baseoff = (uintb)std::__cxx11::list<ParamEntry,_std::allocator<ParamEntry>_>::end(&this->entry);
    bVar1 = std::operator!=(&local_28,(_Self *)&baseoff);
    if (!bVar1) break;
    pPVar3 = std::_List_const_iterator<ParamEntry>::operator*(&local_28);
    pAVar4 = ParamEntry::getSpace(pPVar3);
    if (pAVar4 == spc) {
      pPVar3 = std::_List_const_iterator<ParamEntry>::operator*(&local_28);
      first = ParamEntry::getBase(pPVar3);
      pPVar3 = std::_List_const_iterator<ParamEntry>::operator*(&local_28);
      iVar2 = ParamEntry::getSize(pPVar3);
      RangeList::insertRange((RangeList *)iter._M_node,spc,first,(first + (long)iVar2) - 1);
    }
    std::_List_const_iterator<ParamEntry>::operator++(&local_28);
  }
  return;
}

Assistant:

void ParamListStandard::getRangeList(AddrSpace *spc,RangeList &res) const

{
  list<ParamEntry>::const_iterator iter;
  for(iter=entry.begin();iter!=entry.end();++iter) {
    if ((*iter).getSpace() != spc) continue;
    uintb baseoff = (*iter).getBase();
    uintb endoff = baseoff + (*iter).getSize() - 1;
    res.insertRange(spc,baseoff,endoff);
  }
}